

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O1

StuntDouble * __thiscall OpenMD::SelectionManager::nextSelected(SelectionManager *this,int *i)

{
  pointer pOVar1;
  long lVar2;
  pointer ppSVar3;
  StuntDouble *pSVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  pOVar1 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = *(long *)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_>;
  iVar7 = (*(int *)&(((_Bit_iterator *)
                     ((long)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_> + 0x10))->
                    super__Bit_iterator_base)._M_p - (int)lVar2) * 8;
  iVar5 = *i + 1;
  *i = iVar5;
  if (iVar5 < (int)(*(uint *)((long)&(pOVar1->bitset_).super__Bvector_base<std::allocator<bool>_> +
                             0x18) + iVar7)) {
    ppSVar3 = (this->stuntdoubles_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar6 = (ulong)iVar5;
      uVar8 = uVar6 + 0x3f;
      if (-1 < (long)uVar6) {
        uVar8 = uVar6;
      }
      if (((*(ulong *)(lVar2 + ((long)uVar8 >> 6) * 8 + -8 +
                      (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
            (uVar6 & 0x3f) & 1) != 0) && (pSVar4 = ppSVar3[uVar6], pSVar4 != (StuntDouble *)0x0)) {
        return pSVar4;
      }
      iVar5 = *i + 1;
      *i = iVar5;
    } while (iVar5 < (int)(*(uint *)((long)&(pOVar1->bitset_).
                                            super__Bvector_base<std::allocator<bool>_> + 0x18) +
                          iVar7));
  }
  return (StuntDouble *)0x0;
}

Assistant:

StuntDouble* SelectionManager::nextSelected(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[STUNTDOUBLE].size())) {
      if (ss_.bitsets_[STUNTDOUBLE][i]) {
        // check that this processor owns this stuntdouble
        if (stuntdoubles_[i] != NULL) return stuntdoubles_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[STUNTDOUBLE].nextOnBit(i);
    return i == -1 ? NULL : stuntdoubles_[i];
#endif
  }